

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve.c
# Opt level: O2

void av1_highbd_dist_wtd_convolve_2d_copy_c
               (uint16_t *src,int src_stride,uint16_t *dst,int dst_stride,int w,int h,
               ConvolveParams *conv_params,int bd)

{
  int iVar1;
  CONV_BUF_TYPE *pCVar2;
  char cVar3;
  char cVar4;
  uint16_t uVar5;
  uint uVar6;
  byte bVar7;
  uint16_t *puVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  CONV_BUF_TYPE *local_90;
  uint16_t *local_80;
  
  pCVar2 = conv_params->dst;
  cVar4 = (char)conv_params->round_0 + (char)conv_params->round_1;
  cVar3 = (char)bd - cVar4;
  bVar7 = 0xe - cVar4;
  iVar1 = conv_params->dst_stride;
  iVar10 = (1 << (cVar3 + 0xdU & 0x1f)) + (1 << (cVar3 + 0xeU & 0x1f));
  uVar9 = 0;
  if (w < 1) {
    w = 0;
  }
  uVar12 = (ulong)(uint)h;
  if (h < 1) {
    uVar12 = 0;
  }
  local_90 = pCVar2;
  local_80 = src;
  for (; uVar9 != uVar12; uVar9 = uVar9 + 1) {
    for (uVar11 = 0; (uint)w != uVar11; uVar11 = uVar11 + 1) {
      uVar6 = ((uint)local_80[uVar11] << (bVar7 & 0x1f)) + iVar10;
      uVar5 = (uint16_t)uVar6;
      puVar8 = pCVar2 + uVar9 * (long)iVar1;
      if (conv_params->do_average != 0) {
        if (conv_params->use_dist_wtd_comp_avg == 0) {
          uVar6 = (uVar6 & 0xffff) + (uint)local_90[uVar11] >> 1;
        }
        else {
          uVar6 = (int)((uVar6 & 0xffff) * conv_params->bck_offset +
                       (uint)local_90[uVar11] * conv_params->fwd_offset) >> 4;
        }
        uVar5 = clip_pixel_highbd((int)(uVar6 + (((1 << (bVar7 & 0x1f)) >> 1) - iVar10)) >>
                                  (bVar7 & 0x1f),bd);
        puVar8 = dst + uVar9 * (long)dst_stride;
      }
      puVar8[uVar11] = uVar5;
    }
    local_90 = local_90 + iVar1;
    local_80 = local_80 + src_stride;
  }
  return;
}

Assistant:

void av1_highbd_dist_wtd_convolve_2d_copy_c(const uint16_t *src, int src_stride,
                                            uint16_t *dst, int dst_stride,
                                            int w, int h,
                                            ConvolveParams *conv_params,
                                            int bd) {
  CONV_BUF_TYPE *dst16 = conv_params->dst;
  int dst16_stride = conv_params->dst_stride;
  const int bits =
      FILTER_BITS * 2 - conv_params->round_1 - conv_params->round_0;
  const int offset_bits = bd + 2 * FILTER_BITS - conv_params->round_0;
  const int round_offset = (1 << (offset_bits - conv_params->round_1)) +
                           (1 << (offset_bits - conv_params->round_1 - 1));
  assert(bits >= 0);

  for (int y = 0; y < h; ++y) {
    for (int x = 0; x < w; ++x) {
      CONV_BUF_TYPE res = src[y * src_stride + x] << bits;
      res += round_offset;
      if (conv_params->do_average) {
        int32_t tmp = dst16[y * dst16_stride + x];
        if (conv_params->use_dist_wtd_comp_avg) {
          tmp = tmp * conv_params->fwd_offset + res * conv_params->bck_offset;
          tmp = tmp >> DIST_PRECISION_BITS;
        } else {
          tmp += res;
          tmp = tmp >> 1;
        }
        tmp -= round_offset;
        dst[y * dst_stride + x] =
            clip_pixel_highbd(ROUND_POWER_OF_TWO(tmp, bits), bd);
      } else {
        dst16[y * dst16_stride + x] = res;
      }
    }
  }
}